

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Dtc_ManPrintFadds(Vec_Int_t *vFadds)

{
  int iVar1;
  uint uVar2;
  uint local_14;
  int i;
  Vec_Int_t *vFadds_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFadds);
    if (iVar1 / 5 <= (int)local_14) break;
    printf("%6d : ",(ulong)local_14,(long)iVar1 % 5 & 0xffffffff);
    uVar2 = Vec_IntEntry(vFadds,local_14 * 5);
    printf("%6d ",(ulong)uVar2);
    uVar2 = Vec_IntEntry(vFadds,local_14 * 5 + 1);
    printf("%6d ",(ulong)uVar2);
    uVar2 = Vec_IntEntry(vFadds,local_14 * 5 + 2);
    printf("%6d ",(ulong)uVar2);
    printf(" ->  ");
    uVar2 = Vec_IntEntry(vFadds,local_14 * 5 + 3);
    printf("%6d ",(ulong)uVar2);
    uVar2 = Vec_IntEntry(vFadds,local_14 * 5 + 4);
    printf("%6d ",(ulong)uVar2);
    printf("\n");
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Dtc_ManPrintFadds( Vec_Int_t * vFadds )
{
    int i;
    Dtc_ForEachFadd( vFadds, i )
    {
        printf( "%6d : ", i );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+0) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+1) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+2) );
        printf( " ->  " );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+3) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+4) );
        printf( "\n" );
    }
}